

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

bool __thiscall SymbolTable::isTempName(SymbolTable *this,string *name,string *curFun)

{
  bool bVar1;
  __type _Var2;
  mapped_type *pmVar3;
  reference this_00;
  reference __lhs;
  SymbolTableElement *i;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  int index;
  string *curFun_local;
  string *name_local;
  SymbolTable *this_local;
  
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->funToName,curFun);
  this_00 = std::
            vector<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
            ::operator[](&this->symbolTable,(long)*pmVar3);
  __end1 = std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::begin(this_00);
  i = (SymbolTableElement *)
      std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SymbolTableElement_*,_std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>
                                *)&i);
    if (!bVar1) {
      return false;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<SymbolTableElement_*,_std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>
            ::operator*(&__end1);
    _Var2 = std::operator==(&__lhs->name,name);
    if ((_Var2) && ((__lhs->isTemp & 1U) != 0)) break;
    __gnu_cxx::
    __normal_iterator<SymbolTableElement_*,_std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool SymbolTable::isTempName(string name, string curFun) {
    int index = funToName[curFun];
    for (auto &i : symbolTable[index]) {
        if(i.name == name && i.isTemp) {
            return true;
        }
    }
//    cout << "未找到该变量" << endl;
    return false;
}